

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

VOID InternalDeleteCriticalSection(PCRITICAL_SECTION pCriticalSection)

{
  long lVar1;
  long *plVar2;
  PalCsInitState PVar3;
  BOOL BVar4;
  int iVar5;
  uint uVar6;
  HANDLE pVVar7;
  CPalThread *local_60;
  int iRet;
  PLIST_ENTRY _EX_Flink_1;
  PLIST_ENTRY _EX_Blink_1;
  PLIST_ENTRY _EX_Flink;
  PLIST_ENTRY _EX_Blink;
  int iWaiterCount;
  SIZE_T tid;
  CPalThread *pThread;
  PAL_CRITICAL_SECTION *pPalCriticalSection;
  PCRITICAL_SECTION pCriticalSection_local;
  
  PVar3 = Volatile::operator_cast_to_PalCsInitState((Volatile *)&pCriticalSection->dwInitState);
  if ((PVar3 != PalCsUserInitialized) &&
     (PVar3 = Volatile::operator_cast_to_PalCsInitState((Volatile *)&pCriticalSection->dwInitState),
     PVar3 != PalCsFullyInitialized)) {
    fprintf(_stderr,"] %s %s:%d","InternalDeleteCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x169);
    fprintf(_stderr,
            "Expression: PalCsUserInitialized == pPalCriticalSection->cisInitState || PalCsFullyInitialized == pPalCriticalSection->cisInitState, Description: CS %p is not initialized"
            ,pCriticalSection);
  }
  BVar4 = PALIsThreadDataInitialized();
  if (BVar4 == 0) {
    local_60 = (CPalThread *)0x0;
  }
  else {
    local_60 = CorUnix::GetCurrentPalThread();
  }
  iVar5 = Volatile::operator_cast_to_int((Volatile *)&pCriticalSection->LockCount);
  if (iVar5 != 0) {
    pVVar7 = (HANDLE)ObtainCurrentThreadIdImpl(local_60,"InternalDeleteCriticalSection");
    iVar5 = Volatile::operator_cast_to_int((Volatile *)&pCriticalSection->LockCount);
    uVar6 = Volatile::operator_cast_to_int((Volatile *)&pCriticalSection->LockCount);
    if ((uVar6 & 1) == 0) {
      if (iVar5 / 4 == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
      }
      else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    else if (pVVar7 == pCriticalSection->OwningThread) {
      if (iVar5 / 4 == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
      }
      else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalDeleteCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x17c);
      fprintf(_stderr,"Thread tid=%u deleting a CS owned by thread tid=%u\n",pVVar7,
              pCriticalSection->OwningThread);
    }
  }
  if (pCriticalSection->DebugInfo != (PVOID)0x0) {
    if (pCriticalSection == (PCRITICAL_SECTION)CorUnix::g_csPALCSsListLock) {
      lVar1 = *(long *)CorUnix::g_csPALCSsListLock._0_8_;
      plVar2 = *(long **)(CorUnix::g_csPALCSsListLock._0_8_ + 8);
      *plVar2 = lVar1;
      *(long **)(lVar1 + 8) = plVar2;
    }
    else {
      CorUnix::InternalEnterCriticalSection(local_60,(PCRITICAL_SECTION)CorUnix::g_csPALCSsListLock)
      ;
      lVar1 = *pCriticalSection->DebugInfo;
      plVar2 = *(long **)((long)pCriticalSection->DebugInfo + 8);
      *plVar2 = lVar1;
      *(long **)(lVar1 + 8) = plVar2;
      CorUnix::InternalLeaveCriticalSection(local_60,(PCRITICAL_SECTION)CorUnix::g_csPALCSsListLock)
      ;
    }
    CorUnix::InternalDelete<_CRITICAL_SECTION_DEBUG_INFO>
              ((_CRITICAL_SECTION_DEBUG_INFO *)pCriticalSection->DebugInfo);
    pCriticalSection->DebugInfo = (PVOID)0x0;
  }
  PVar3 = Volatile::operator_cast_to_PalCsInitState((Volatile *)&pCriticalSection->dwInitState);
  if (PVar3 == PalCsFullyInitialized) {
    uVar6 = pthread_cond_destroy((pthread_cond_t *)((long)&pCriticalSection->csnds + 0x28));
    if (uVar6 != 0) {
      fprintf(_stderr,"] %s %s:%d","InternalDeleteCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x1dd);
      fprintf(_stderr,
              "Expression: 0 == iRet, Description: Failed destroying condition in CS @ %p [err=%d]\n"
              ,pCriticalSection,(ulong)uVar6);
    }
    uVar6 = pthread_mutex_destroy((pthread_mutex_t *)&pCriticalSection->csnds);
    if (uVar6 != 0) {
      fprintf(_stderr,"] %s %s:%d","InternalDeleteCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x1e2);
      fprintf(_stderr,
              "Expression: 0 == iRet, Description: Failed destroying mutex in CS @ %p [err=%d]\n",
              pCriticalSection,(ulong)uVar6);
    }
  }
  Volatile<PalCsInitState>::operator=
            ((Volatile<PalCsInitState> *)&pCriticalSection->dwInitState,PalCsNotInitialized);
  return;
}

Assistant:

VOID InternalDeleteCriticalSection(
    PCRITICAL_SECTION pCriticalSection)
{
    PAL_CRITICAL_SECTION * pPalCriticalSection =
        reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);

    _ASSERT_MSG(PalCsUserInitialized == pPalCriticalSection->cisInitState ||
                PalCsFullyInitialized == pPalCriticalSection->cisInitState,
                "CS %p is not initialized", pPalCriticalSection);

#ifdef _DEBUG
    CPalThread * pThread =
        (PALIsThreadDataInitialized() ? GetCurrentPalThread() : NULL);

    if (0 != pPalCriticalSection->LockCount)
    {
        SIZE_T tid;
        tid = ObtainCurrentThreadId(pThread);
        int iWaiterCount = (int)PALCS_GETWCOUNT(pPalCriticalSection->LockCount);

        if (0 != (PALCS_LOCK_BIT & pPalCriticalSection->LockCount))
        {
            // CS is locked
            if (tid != pPalCriticalSection->OwningThread)
            {
                // not owner
                ASSERT("Thread tid=%u deleting a CS owned by thread tid=%u\n",
                       tid, pPalCriticalSection->OwningThread);
            }
            else
            {
                // owner
                if (0 != iWaiterCount)
                {
                    ERROR("Thread tid=%u is deleting a CS with %d threads waiting on it\n",
                          tid, iWaiterCount);
                }
                else
                {
                    WARN("Thread tid=%u is deleting a critical section it still owns\n",
                         tid);
                }
            }
        }
        else
        {
            // CS is not locked
            if (0 != iWaiterCount)
            {
                ERROR("Deleting a CS with %d threads waiting on it\n",
                      iWaiterCount);
            }
            else
            {
                ERROR("Thread tid=%u is deleting a critical section currently not "
                      "owned, but with one waiter awakened\n", tid);
            }
        }
    }

    if (NULL != pPalCriticalSection->DebugInfo)
    {
        if (pPalCriticalSection != &CorUnix::g_csPALCSsListLock)
        {
            InternalEnterCriticalSection(pThread,
                reinterpret_cast<CRITICAL_SECTION*>(&g_csPALCSsListLock));
            RemoveEntryList(&pPalCriticalSection->DebugInfo->Link);
            InternalLeaveCriticalSection(pThread,
                reinterpret_cast<CRITICAL_SECTION*>(&g_csPALCSsListLock));
        }
        else
        {
            RemoveEntryList(&pPalCriticalSection->DebugInfo->Link);
        }

#ifdef PAL_TRACK_CRITICAL_SECTIONS_DATA
        LONG lVal, lNewVal;
        Volatile<LONG> * plDest;

        // Update delete count
        InterlockedIncrement(pPalCriticalSection->fInternal ?
            &g_lPALCSInternalDeleteCount : &g_lPALCSDeleteCount);

        // Update acquire count
        plDest = pPalCriticalSection->fInternal ?
            &g_lPALCSInternalAcquireCount : &g_lPALCSAcquireCount;
        do {
            lVal = *plDest;
            lNewVal = lVal + pPalCriticalSection->DebugInfo->lAcquireCount;
            lNewVal = InterlockedCompareExchange(plDest, lNewVal, lVal);
        } while (lVal != lNewVal);

        // Update enter count
        plDest = pPalCriticalSection->fInternal ?
            &g_lPALCSInternalEnterCount : &g_lPALCSEnterCount;
        do {
            lVal = *plDest;
            lNewVal = lVal + pPalCriticalSection->DebugInfo->lEnterCount;
            lNewVal = InterlockedCompareExchange(plDest, lNewVal, lVal);
        } while (lVal != lNewVal);

        // Update contention count
        plDest = pPalCriticalSection->fInternal ?
            &g_lPALCSInternalContentionCount : &g_lPALCSContentionCount;
        do {
            lVal = *plDest;
            lNewVal = lVal + pPalCriticalSection->DebugInfo->lContentionCount;
            lNewVal = InterlockedCompareExchange(plDest, lNewVal, lVal);
        } while (lVal != lNewVal);

#endif // PAL_TRACK_CRITICAL_SECTIONS_DATA

        InternalDelete(pPalCriticalSection->DebugInfo);
        pPalCriticalSection->DebugInfo = NULL;
    }
#endif // _DEBUG

    if (PalCsFullyInitialized == pPalCriticalSection->cisInitState)
    {
        int iRet;

        // destroy condition
        iRet = pthread_cond_destroy(&pPalCriticalSection->csndNativeData.condition);
        _ASSERT_MSG(0 == iRet, "Failed destroying condition in CS @ %p "
                    "[err=%d]\n", pPalCriticalSection, iRet);

        // destroy mutex
        iRet = pthread_mutex_destroy(&pPalCriticalSection->csndNativeData.mutex);
        _ASSERT_MSG(0 == iRet, "Failed destroying mutex in CS @ %p "
                    "[err=%d]\n", pPalCriticalSection, iRet);
    }

    // Reset critical section state
    pPalCriticalSection->cisInitState = PalCsNotInitialized;
}